

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O0

Symbol * dyn_entry(GlobalVars *gv,DynArg arg,int entrytype)

{
  int in_EDX;
  DynArg in_RSI;
  GlobalVars *in_RDI;
  Symbol *local_8;
  
  make_dynobj((GlobalVars *)0x113e4c);
  if (fff[in_RDI->dest_format]->dynentry == (_func_Symbol_ptr_GlobalVars_ptr_DynArg_int *)0x0) {
    error(0x7e,fff[in_RDI->dest_format]->tname);
    local_8 = (Symbol *)0x0;
  }
  else {
    local_8 = (*fff[in_RDI->dest_format]->dynentry)(in_RDI,in_RSI,in_EDX);
  }
  return local_8;
}

Assistant:

static struct Symbol *dyn_entry(struct GlobalVars *gv,DynArg arg,int entrytype)
{
  make_dynobj(gv);

  if (fff[gv->dest_format]->dynentry)
    return fff[gv->dest_format]->dynentry(gv,arg,entrytype);
  
  /* dynamic symbol reference not supported by target */
  error(126,fff[gv->dest_format]->tname);
  return NULL;
}